

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.cc
# Opt level: O0

int bn_print(BIO *bp,char *name,BIGNUM *num,int off)

{
  BIGNUM *pBVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  ulong len_00;
  uint8_t *data;
  char *pcVar5;
  uint local_54;
  int ret;
  uint8_t *buf;
  size_t len;
  char *neg;
  uint64_t u64;
  BIGNUM *pBStack_28;
  int off_local;
  BIGNUM *num_local;
  char *name_local;
  BIO *bp_local;
  
  if (num == (BIGNUM *)0x0) {
    bp_local._4_4_ = 1;
  }
  else {
    u64._4_4_ = off;
    pBStack_28 = (BIGNUM *)num;
    num_local = (BIGNUM *)name;
    name_local = (char *)bp;
    iVar2 = BIO_indent((BIO *)bp,off,0x80);
    if (iVar2 == 0) {
      bp_local._4_4_ = 0;
    }
    else {
      iVar2 = BN_is_zero((BIGNUM *)pBStack_28);
      if (iVar2 == 0) {
        iVar2 = BN_get_u64((BIGNUM *)pBStack_28,(uint64_t *)&neg);
        pcVar4 = name_local;
        pBVar1 = num_local;
        if (iVar2 == 0) {
          iVar2 = BN_is_negative((BIGNUM *)pBStack_28);
          pcVar5 = "";
          if (iVar2 != 0) {
            pcVar5 = " (Negative)";
          }
          iVar2 = BIO_printf((BIO *)pcVar4,"%s%s",pBVar1,pcVar5);
          if (iVar2 < 1) {
            bp_local._4_4_ = 0;
          }
          else {
            uVar3 = BN_num_bytes((BIGNUM *)pBStack_28);
            len_00 = (ulong)uVar3;
            data = (uint8_t *)OPENSSL_malloc(len_00 + 1);
            if (data == (uint8_t *)0x0) {
              bp_local._4_4_ = 0;
            }
            else {
              *data = '\0';
              BN_bn2bin(pBStack_28,data + 1);
              if ((len_00 == 0) || ((data[1] & 0x80) == 0)) {
                local_54 = print_hex((BIO *)name_local,data + 1,len_00,u64._4_4_);
              }
              else {
                local_54 = print_hex((BIO *)name_local,data,len_00 + 1,u64._4_4_);
              }
              OPENSSL_free(data);
              bp_local._4_4_ = local_54;
            }
          }
        }
        else {
          iVar2 = BN_is_negative((BIGNUM *)pBStack_28);
          pcVar4 = "";
          if (iVar2 != 0) {
            pcVar4 = "-";
          }
          iVar2 = BIO_printf((BIO *)name_local,"%s %s%lu (%s0x%lx)\n",num_local,pcVar4,neg,pcVar4,
                             neg);
          bp_local._4_4_ = (uint)(0 < iVar2);
        }
      }
      else {
        iVar2 = BIO_printf((BIO *)name_local,"%s 0\n",num_local);
        if (iVar2 < 1) {
          bp_local._4_4_ = 0;
        }
        else {
          bp_local._4_4_ = 1;
        }
      }
    }
  }
  return bp_local._4_4_;
}

Assistant:

static int bn_print(BIO *bp, const char *name, const BIGNUM *num, int off) {
  if (num == NULL) {
    return 1;
  }

  if (!BIO_indent(bp, off, 128)) {
    return 0;
  }
  if (BN_is_zero(num)) {
    if (BIO_printf(bp, "%s 0\n", name) <= 0) {
      return 0;
    }
    return 1;
  }

  uint64_t u64;
  if (BN_get_u64(num, &u64)) {
    const char *neg = BN_is_negative(num) ? "-" : "";
    return BIO_printf(bp, "%s %s%" PRIu64 " (%s0x%" PRIx64 ")\n", name, neg,
                      u64, neg, u64) > 0;
  }

  if (BIO_printf(bp, "%s%s", name,
                 (BN_is_negative(num)) ? " (Negative)" : "") <= 0) {
    return 0;
  }

  // Print |num| in hex, adding a leading zero, as in ASN.1, if the high bit
  // is set.
  //
  // TODO(davidben): Do we need to do this? We already print "(Negative)" above
  // and negative values are never valid in keys anyway.
  size_t len = BN_num_bytes(num);
  uint8_t *buf = reinterpret_cast<uint8_t *>(OPENSSL_malloc(len + 1));
  if (buf == NULL) {
    return 0;
  }

  buf[0] = 0;
  BN_bn2bin(num, buf + 1);
  int ret;
  if (len > 0 && (buf[1] & 0x80) != 0) {
    // Print the whole buffer.
    ret = print_hex(bp, buf, len + 1, off);
  } else {
    // Skip the leading zero.
    ret = print_hex(bp, buf + 1, len, off);
  }
  OPENSSL_free(buf);
  return ret;
}